

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O3

int __thiscall TPZSkylMatrix<std::complex<float>_>::Clear(TPZSkylMatrix<std::complex<float>_> *this)

{
  complex<float> *pcVar1;
  complex<float> **ppcVar2;
  
  if ((this->fStorage).fNElements != 0) {
    (this->fStorage).fNElements = 0;
    (this->fStorage).fNAlloc = 0;
    pcVar1 = (this->fStorage).fStore;
    if (pcVar1 != (complex<float> *)0x0) {
      operator_delete__(pcVar1);
    }
    (this->fStorage).fStore = (complex<float> *)0x0;
  }
  if ((this->fElem).fNElements != 0) {
    (this->fElem).fNElements = 0;
    (this->fElem).fNAlloc = 0;
    ppcVar2 = (this->fElem).fStore;
    if (ppcVar2 != (complex<float> **)0x0) {
      operator_delete__(ppcVar2);
    }
    (this->fElem).fStore = (complex<float> **)0x0;
  }
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow = 0;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol = 0;
  (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDecomposed = '\0';
  return 1;
}

Assistant:

int
TPZSkylMatrix<TVar>::Clear()
{
    this->fStorage.Resize(0);
    //	fStorage.Shrink();
    this->fElem.Resize(0);
    this->fRow = this->fCol = 0;
    this->fDecomposed = 0;
    return( 1 );
}